

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O0

void stbds_strreset(stbds_string_arena *a)

{
  stbds_string_block *psVar1;
  stbds_string_block *y;
  stbds_string_block *x;
  stbds_string_arena *a_local;
  
  y = a->storage;
  while (y != (stbds_string_block *)0x0) {
    psVar1 = y->next;
    free(y);
    y = psVar1;
  }
  memset(a,0,0x18);
  return;
}

Assistant:

void stbds_strreset(stbds_string_arena *a)
{
  stbds_string_block *x,*y;
  x = a->storage;
  while (x) {
    y = x->next;
    STBDS_FREE(NULL, x);
    x = y;
  }
  memset(a, 0, sizeof(*a));
}